

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-parse.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  atomic_count *paVar1;
  char *pcVar2;
  long *plVar3;
  func_type p_Var4;
  scheduler_operation *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  error_category *peVar7;
  _func_int ***ppp_Var8;
  undefined8 uVar9;
  undefined2 port_num;
  uint uVar10;
  bool bVar11;
  size_t sVar12;
  ostream *poVar13;
  scheduler_operation *psVar14;
  element_type *peVar15;
  element_type *peVar16;
  socklen_t __len;
  scheduler_operation *psVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  sockaddr *__addr;
  int iVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  service *psVar20;
  spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>
  *context;
  undefined8 uVar21;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  io_context io_service;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dst_parts;
  type ex;
  socket_t socket;
  string address;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd_items;
  Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  c;
  endpoint end_point;
  address ip_address;
  allocator_t<std::allocator<void>_> local_24a;
  allocator<void> local_249;
  undefined1 local_248 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  scheduler_operation *local_220;
  type local_218;
  undefined1 local_1f8 [12];
  uint uStack_1ec;
  element_type *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [12];
  uint uStack_1bc;
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  object_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168 [2];
  anon_union_16_2_ba345be5_for_m_Storage local_148;
  ulong local_138;
  scheduler_operation *local_130;
  uint local_124;
  undefined1 local_120 [16];
  ptr local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  undefined1 local_c0 [8];
  error_category *local_b8;
  data_union local_6c;
  address local_50;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage : ",8);
    pcVar2 = *argv;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197408);
    }
    else {
      sVar12 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," ip:port channel1 channel2 ...\n",0x1f);
    return 1;
  }
  std::__cxx11::string::string((string *)&local_f8,argv[1],(allocator *)local_198);
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._0_8_ = ":";
  local_198._8_8_ = "";
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_148,(iterator_range<const_char_*> *)local_198);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
            (&local_238,&local_f8,(is_any_ofF<char> *)&local_148,token_compress_off);
  if ((0x10 < local_138) && (local_148.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_148.m_dynSet);
  }
  if ((long)local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage : ",8);
    pcVar2 = *argv;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197408);
    }
    else {
      sVar12 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar12);
    }
    iVar19 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," ip:port channel1 channel2 ...\n",0x1f);
    goto LAB_00155ee8;
  }
  local_198._0_8_ = &local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"subscribe","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_198;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,__l,(allocator_type *)local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._0_8_ != &local_188) {
    operator_delete((void *)local_198._0_8_);
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (argv + 2,argv + (uint)argc,&local_d8);
  boost::asio::io_context::io_context((io_context *)local_248);
  pcVar2 = ((local_238.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  boost::system::error_code::error_code((error_code *)local_c0);
  boost::asio::ip::make_address(&local_50,pcVar2,(error_code *)local_c0);
  if (local_c0[4] == true) {
    std::runtime_error::runtime_error((runtime_error *)local_198,"");
    local_178.__align = (anon_struct_8_0_00000001_for___align)local_168;
    local_198._0_8_ = &PTR__system_error_001928b8;
    local_188._M_allocated_capacity = (size_type)local_c0;
    local_188._8_8_ = local_b8;
    local_178._8_8_ = 0;
    local_168[0]._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_198);
  }
  local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffff0000;
  local_198._8_8_ =
       local_238.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  local_188._M_allocated_capacity =
       (long)&(((service_type *)local_198._8_8_)->
              super_execution_context_service_base<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>_>
              ).super_service._vptr_service +
       local_238.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
  local_c0 = (undefined1  [8])local_198._8_8_;
  local_b8 = (error_category *)local_188._M_allocated_capacity;
  bVar11 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
           shr_unsigned<unsigned_short>
                     ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)local_c0,
                      (unsigned_short *)local_1d8);
  if (!bVar11) {
    local_198._0_8_ = &PTR__bad_cast_00193480;
    local_198._8_8_ = &std::__cxx11::string::typeinfo;
    local_188._M_allocated_capacity = (size_type)&unsigned_short::typeinfo;
    boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_198);
  }
  port_num = local_1d8._0_2_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"connecting to ",0xe);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)&local_6c.base,&local_50,port_num);
  local_c0._0_4_ = (uint)(local_6c.base.sa_family != 2) * 8 + 2;
  __len = 0;
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            ((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_198,(io_context *)local_248,(protocol_type *)local_c0,(type *)0x0);
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::connect((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)local_198,(int)&local_6c,__addr,__len);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"connected\n",10);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)local_c0,
                   (io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)local_198);
  psVar14 = (scheduler_operation *)boost::coroutines::stack_traits::default_size();
  local_124 = 0;
  local_130 = (scheduler_operation *)local_248;
  boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>::
  create_implementation<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>
            ((basic_executor_type<std::allocator<void>,_0U> *)local_120,&local_130);
  uVar9 = local_120._8_8_;
  uVar10 = local_124;
  psVar5 = local_130;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_120._8_8_ + 8) = *(_Atomic_word *)(local_120._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_120._8_8_ + 8) = *(_Atomic_word *)(local_120._8_8_ + 8) + 1;
    }
  }
  local_220 = psVar14;
  boost::coroutines::stack_traits::default_size();
  peVar15 = (element_type *)operator_new(0x58);
  (peVar15->coro_).
  super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (peVar15->coro_).
  super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar9 + 8) = *(_Atomic_word *)(uVar9 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar9 + 8) = *(_Atomic_word *)(uVar9 + 8) + 1;
    }
  }
  (peVar15->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .executor_.executor_.io_context_ = (io_context *)psVar5;
  (peVar15->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .executor_.executor_.bits_ = uVar10;
  (peVar15->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .executor_.impl_.
  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_120._0_8_;
  (peVar15->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .executor_.impl_.
  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
  (peVar15->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .target_ = boost::asio::detail::default_spawn_handler;
  peVar15->call_handler_ = true;
  (peVar15->function_).cmd_items = &local_d8;
  (peVar15->function_).c =
       (Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
        *)local_c0;
  (peVar15->function_).io_service = (io_context *)local_248;
  psVar14 = (scheduler_operation *)operator_new(0x18);
  psVar14->func_ = (func_type)0x100000001;
  psVar14->next_ = (scheduler_operation *)&PTR___Sp_counted_base_00193b48;
  *(element_type **)&psVar14->task_result_ = peVar15;
  local_1f8._0_8_ = psVar5;
  uStack_1ec = uVar10;
  local_1e8 = (element_type *)local_120._0_8_;
  local_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar9 + 8) = *(_Atomic_word *)(uVar9 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar9 + 8) = *(_Atomic_word *)(uVar9 + 8) + 1;
    }
  }
  context = (spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>
             *)&asio_prefer_fn::static_instance<asio_prefer_fn::impl>::instance;
  asio_prefer_fn::impl::operator()
            (&local_218,(impl *)&asio_prefer_fn::static_instance<asio_prefer_fn::impl>::instance,
             (strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *)
             local_1f8,(possibly_t<0> *)&boost::asio::execution::detail::blocking_t<0>::possibly,
             &local_24a);
  if ((local_218.executor_.bits_ & 1) == 0) {
    for (plVar3 = *(long **)(in_FS_OFFSET + -8); plVar3 != (long *)0x0; plVar3 = (long *)plVar3[2])
    {
      if ((element_type *)*plVar3 ==
          (element_type *)
          local_218.impl_.
          super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr) {
        if (plVar3[1] != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&psVar14->func_ = *(int *)&psVar14->func_ + 1;
            UNLOCK();
          }
          else {
            *(int *)&psVar14->func_ = *(int *)&psVar14->func_ + 1;
          }
          local_1c8._0_8_ = local_220;
          stack0xfffffffffffffe40 =
               (error_category *)((ulong)stack0xfffffffffffffe40 & 0xffffffff00000000);
          local_1d8._0_8_ = peVar15;
          local_1d8._8_8_ = psVar14;
          boost_asio_handler_invoke_helpers::
          invoke<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void(*)(),boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>>,main::__0>,boost::asio::detail::spawn_helper<boost::asio::executor_binder<void(*)(),boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>>,main::__0>>
                    ((spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>
                      *)local_1d8,context);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
          }
          goto LAB_00155dc9;
        }
        break;
      }
    }
  }
  local_110.a = &local_249;
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    uVar21 = 0;
  }
  else {
    uVar21 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  peVar16 = (element_type *)
            boost::asio::detail::thread_info_base::
            allocate<boost::asio::detail::thread_info_base::default_tag>(uVar21,0x40);
  ((scheduler_operation *)&peVar16->mutex_)->next_ = (scheduler_operation *)0x0;
  *(code **)&peVar16->locked_ =
       boost::asio::detail::
       executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/stream-parse.cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       ::do_complete;
  *(uint *)&(peVar16->waiting_queue_).front_ = 0;
  (peVar16->waiting_queue_).back_ = (scheduler_operation *)peVar15;
  (peVar16->ready_queue_).front_ = psVar14;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&psVar14->func_ = *(int *)&psVar14->func_ + 1;
    UNLOCK();
  }
  else {
    *(int *)&psVar14->func_ = *(int *)&psVar14->func_ + 1;
  }
  (peVar16->ready_queue_).back_ = local_220;
  *(flag_unwind_t *)&peVar16->next_ = stack_unwind;
  local_110.v = peVar16;
  local_110.p = (executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                 *)peVar16;
  pthread_mutex_lock((pthread_mutex_t *)
                     (((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                      &(local_218.impl_.
                        super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->mutex_)->
                     super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  if (*(bool *)((long)&(((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                        &(local_218.impl_.
                          super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mutex_)->
                       super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_refcount._M_pi + 1) == true) {
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               (((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                &(local_218.impl_.
                  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->mutex_)->
               super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr);
    p_Var4 = *(func_type *)&peVar16->locked_;
    boost::system::error_code::error_code((error_code *)local_1d8);
    (*p_Var4)((void *)0x0,(scheduler_operation *)peVar16,(error_code *)local_1d8,0);
LAB_00155db4:
    local_110.v = (void *)0x0;
    local_110.p = (executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                   *)0x0;
  }
  else {
    if (*(bool *)&(((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                   &(local_218.impl_.
                     super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->mutex_)->
                  super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount._M_pi == true) {
      ((scheduler_operation *)&peVar16->mutex_)->next_ = (scheduler_operation *)0x0;
      psVar5 = *(scheduler_operation **)
                &(((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
                    *)&(local_218.impl_.
                        super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->waiting_queue_)->
                 super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
                 ).executor_.executor_.field_0x8;
      psVar17 = (scheduler_operation *)
                &(((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
                    *)&(local_218.impl_.
                        super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->waiting_queue_)->
                 super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
                 ).executor_.executor_.field_0x8;
      if (psVar5 != (scheduler_operation *)0x0) {
        psVar17 = psVar5;
      }
      psVar17->next_ = (scheduler_operation *)peVar16;
      (&(((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
           *)&(local_218.impl_.
               super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->waiting_queue_)->
        super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
        ).executor_.executor_.io_context_)[psVar5 != (scheduler_operation *)0x0] =
           (io_context *)peVar16;
      pthread_mutex_unlock
                ((pthread_mutex_t *)
                 (((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                  &(local_218.impl_.
                    super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->mutex_)->
                 super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr);
      goto LAB_00155db4;
    }
    *(bool *)&(((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
               &(local_218.impl_.
                 super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->mutex_)->
              super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>)
              ._M_refcount._M_pi = true;
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               (((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                &(local_218.impl_.
                  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->mutex_)->
               super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr);
    ((scheduler_operation *)&peVar16->mutex_)->next_ = (scheduler_operation *)0x0;
    p_Var6 = (((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
                *)&(local_218.impl_.
                    super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->waiting_queue_)->
             super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
             ).executor_.impl_.
             super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              &(((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
                  *)&(local_218.impl_.
                      super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->waiting_queue_)->
               super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
               ).executor_.impl_.
               super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var18 = p_Var6;
    }
    p_Var18->_vptr__Sp_counted_base = (_func_int **)peVar16;
    (&(((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
         *)&(local_218.impl_.
             super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->waiting_queue_)->
      super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
      ).executor_.impl_.
      super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)[p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0] = peVar16;
    local_110.v = (void *)0x0;
    local_110.p = (executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                   *)0x0;
    local_1d8._0_8_ =
         local_218.impl_.
         super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_1d8._8_8_ =
         local_218.impl_.
         super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_218.impl_.
        super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_218.impl_.
         super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_218.impl_.
              super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_218.impl_.
         super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_218.impl_.
              super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_1c8._0_8_ = local_218.executor_.io_context_;
    stack0xfffffffffffffe40 = (error_category *)CONCAT44(local_218.executor_.bits_,local_1c8._8_4_);
    if ((scheduler_operation *)local_218.executor_.io_context_ != (scheduler_operation *)0x0) {
      LOCK();
      paVar1 = &(local_218.executor_.io_context_)->impl_->outstanding_work_;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<boost::asio::detail::strand_executor_service::invoker<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>const,void>>
              ((basic_executor_type<std::allocator<void>,0u> *)&local_218,
               (invoker<const_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_void>
                *)local_1d8);
    boost::asio::io_context::basic_executor_type<std::allocator<void>,_4U>::~basic_executor_type
              ((basic_executor_type<std::allocator<void>,_4U> *)local_1c8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
    }
  }
  boost::asio::detail::
  executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/stream-parse.cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  ::ptr::reset(&local_110);
LAB_00155dc9:
  if (local_218.impl_.
      super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.impl_.
               super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar14);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
  }
  boost::system::error_code::error_code((error_code *)local_1f8);
  boost::asio::detail::scheduler::run((scheduler *)local_248._8_8_,(error_code *)local_1f8);
  uVar9 = local_1f8._0_8_;
  if (local_1f8[4] == true) {
    peVar7 = (error_category *)CONCAT44(uStack_1ec,local_1f8._8_4_);
    std::runtime_error::runtime_error((runtime_error *)local_1d8,"");
    local_1b8._M_p = (pointer)&local_1a8;
    local_1d8._0_8_ = &PTR__system_error_001928b8;
    local_1c8._0_8_ = uVar9;
    local_1b0 = 0;
    local_1a8._M_local_buf[0] = '\0';
    unique0x1000136e = peVar7;
    boost::throw_exception<boost::system::system_error>((system_error *)local_1d8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"exiting...",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_c0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_198);
  for (psVar20 = *(service **)(local_248._0_8_ + 0x38); uVar9 = local_248._0_8_,
      psVar20 != (service *)0x0; psVar20 = psVar20->next_) {
    (*psVar20->_vptr_service[2])(psVar20);
  }
  psVar20 = *(service **)(local_248._0_8_ + 0x38);
  while (psVar20 != (service *)0x0) {
    ppp_Var8 = &psVar20->_vptr_service;
    psVar20 = psVar20->next_;
    (*(*ppp_Var8)[1])();
    *(service **)(uVar9 + 0x38) = psVar20;
  }
  if ((service_registry *)local_248._0_8_ != (service_registry *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)&((service_registry *)local_248._0_8_)->mutex_);
    operator_delete((void *)local_248._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  iVar19 = 0;
LAB_00155ee8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  return iVar19;
}

Assistant:

int main(int argc, char **argv) {
    // common setup
    using socket_t = asio::ip::tcp::socket;
    using next_layer_t = socket_t;
    using Buffer = boost::asio::streambuf;
    using Iterator = typename r::to_iterator<Buffer>::iterator_t;

    if (argc < 2) {
        std::cout << "Usage : " << argv[0]
                  << " ip:port channel1 channel2 ...\n";
        return 1;
    }

    std::string address(argv[1]);
    std::vector<std::string> dst_parts;
    boost::split(dst_parts, address, boost::is_any_of(":"));
    if (dst_parts.size() != 2) {
        std::cout << "Usage : " << argv[0]
                  << " ip:port channel1 channel2 ...\n";
        return 1;
    }

    std::vector<std::string> cmd_items{"subscribe"};
    std::copy(&argv[2], &argv[argc], std::back_inserter(cmd_items));

    // connect to redis
    asio::io_context io_service;
    auto ip_address = asio::ip::make_address(dst_parts[0]);
    auto port = boost::lexical_cast<std::uint16_t>(dst_parts[1]);
    std::cout << "connecting to " << address << "\n";
    asio::ip::tcp::endpoint end_point(ip_address, port);
    socket_t socket(io_service, end_point.protocol());
    socket.connect(end_point);
    std::cout << "connected\n";

    // wrap socket into bredis connection
    r::Connection<next_layer_t> c(std::move(socket));

    // let's have it synchronous-like sexy syntax
    boost::asio::spawn(io_service, [&](boost::asio::yield_context
                                           yield) mutable {
        boost::system::error_code error_code;

        // this is rx_and tx_buff simultaneously. Usually,
        // you should NOT do that, i.e. in case of pipe-lining
        Buffer buff;

        // write subscription command
        r::single_command_t subscribe_cmd{cmd_items.cbegin(), cmd_items.cend()};
        auto consumed = c.async_write(buff, subscribe_cmd, yield[error_code]);

        if (error_code) {
            std::cout << "subscription error :: " << error_code.message()
                      << "\n";
            io_service.stop();
        }
        std::cout << "send subscription\n";
        buff.consume(consumed);

        // check subscription
        {
            r::marker_helpers::check_subscription<Iterator> check_subscription{
                std::move(subscribe_cmd)};

            for (auto it = cmd_items.cbegin() + 1; it != cmd_items.cend();
                 it++) {
                auto parse_result = c.async_read(buff, yield[error_code], 1);
                std::cout << "received something...\n";
                if (error_code) {
                    std::cout
                        << "reading result error :: " << error_code.message()
                        << "\n";
                    io_service.stop();
                    return;
                }

                bool confimed = boost::apply_visitor(check_subscription,
                                                     parse_result.result);
                if (!confimed) {
                    std::cout << "subscription was not confirmed\n";
                    io_service.stop();
                    return;
                }
                buff.consume(parse_result.consumed);
            }
            std::cout << "subscription(s) has been confirmed\n";
        }

        while (true) {
            // read the reply
            auto parse_result = c.async_read(buff, yield[error_code], 1);
            std::cout << "received something...\n";
            if (error_code) {
                std::cout << "reading result error :: " << error_code.message()
                          << "\n";
                break;
            }
            // extract the JSON from message payload

            json_extractor<Iterator> extract;
            auto payload = boost::apply_visitor(extract, parse_result.result);

            if (payload) {
                std::cout << "on channel '" << payload.get().channel
                          << "' got json :: " << payload.get().json.serialize()
                          << "\n";
            } else {
                std::cout << "wasn't able to parse payload as json\n";
            }

            buff.consume(parse_result.consumed);
        }
        io_service.stop();

    });

    io_service.run();
    std::cout << "exiting..."
              << "\n";
    return 0;
}